

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_field.cpp
# Opt level: O2

void __thiscall bidfx_public_api::price::PriceField::~PriceField(PriceField *this)

{
  string *this_00;
  
  if (this->type_ == STRING) {
    this_00 = (this->field_1).string_value_;
    if (this_00 != (string *)0x0) {
      std::__cxx11::string::~string((string *)this_00);
    }
    operator_delete(this_00,0x20);
    return;
  }
  return;
}

Assistant:

PriceField::~PriceField()
{
    if (type_ == STRING)
    {
        delete string_value_;
    }
}